

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall
lest::make_string<nonstd::expected_lite::expected<Implicit,char>>
          (lest *this,expected<Implicit,_char> *item)

{
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream os;
  expected<Implicit,_char> *item_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  operator<<((ostream *)local_190,item);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}